

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

void Vga_ManPrintCore(Vta_Man_t *p,Vec_Int_t *vCore,int Lift)

{
  int level;
  long lVar1;
  
  level = (int)p;
  if (0 < vCore->nSize) {
    lVar1 = 0;
    do {
      Abc_Print(level,"%d*%d ",(ulong)(p->nObjMask & vCore->pArray[lVar1]),
                (ulong)(uint)((vCore->pArray[lVar1] >> ((byte)p->nObjBits & 0x1f)) + Lift));
      lVar1 = lVar1 + 1;
    } while (lVar1 < vCore->nSize);
  }
  Abc_Print(level,"\n");
  return;
}

Assistant:

void Vga_ManPrintCore( Vta_Man_t * p, Vec_Int_t * vCore, int Lift )
{
    int i, Entry, iObj, iFrame;
    Vec_IntForEachEntry( vCore, Entry, i )
    {
        iObj   = (Entry &  p->nObjMask);
        iFrame = (Entry >> p->nObjBits);
        Abc_Print( 1, "%d*%d ", iObj, iFrame+Lift );
    }
    Abc_Print( 1, "\n" );
}